

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_layout_row_template_end(nk_context *ctx)

{
  nk_panel *pnVar1;
  bool bVar2;
  float *pfVar3;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float *width_1;
  int enough_space;
  float var_width;
  float space;
  float width;
  float max_variable_width;
  float total_fixed_width;
  float min_fixed_width;
  int min_variable_count;
  int variable_count;
  int i;
  nk_panel *layout;
  nk_window *win;
  nk_context *ctx_local;
  
  min_fixed_width = 0.0;
  total_fixed_width = 0.0;
  max_variable_width = 0.0;
  width = 0.0;
  space = 0.0;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x457d,"void nk_layout_row_template_end(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x457e,"void nk_layout_row_template_end(struct nk_context *)");
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x457f,"void nk_layout_row_template_end(struct nk_context *)");
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    pnVar1 = ctx->current->layout;
    if ((pnVar1->row).type != NK_LAYOUT_TEMPLATE) {
      __assert_fail("layout->row.type == NK_LAYOUT_TEMPLATE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                    ,0x4585,"void nk_layout_row_template_end(struct nk_context *)");
    }
    if ((pnVar1->row).type == NK_LAYOUT_TEMPLATE) {
      for (min_variable_count = 0; min_variable_count < (pnVar1->row).columns;
          min_variable_count = min_variable_count + 1) {
        local_54 = (pnVar1->row).templates[min_variable_count];
        if (local_54 < 0.0) {
          if (-1.0 <= local_54) {
            total_fixed_width = (float)((int)total_fixed_width + 1);
          }
          else {
            local_54 = -local_54;
            width = local_54 + width;
            if (local_54 <= space) {
              local_54 = space;
            }
            space = local_54;
          }
          min_fixed_width = (float)((int)min_fixed_width + 1);
        }
        else {
          width = local_54 + width;
          max_variable_width = local_54 + max_variable_width;
        }
      }
      if (min_fixed_width != 0.0) {
        local_5c = nk_layout_row_calculate_usable_space
                             (&ctx->style,pnVar1->type,(pnVar1->bounds).w,(pnVar1->row).columns);
        if (0.0 <= local_5c - max_variable_width) {
          local_58 = local_5c - max_variable_width;
        }
        else {
          local_58 = 0.0;
        }
        width_1._4_4_ = local_58 / (float)(int)min_fixed_width;
        bVar2 = space <= width_1._4_4_;
        if (!bVar2) {
          if (0.0 <= local_5c - width) {
            local_5c = local_5c - width;
          }
          else {
            local_5c = 0.0;
          }
          width_1._4_4_ = local_5c / (float)(int)total_fixed_width;
        }
        for (min_variable_count = 0; min_variable_count < (pnVar1->row).columns;
            min_variable_count = min_variable_count + 1) {
          pfVar3 = (pnVar1->row).templates + min_variable_count;
          if (*pfVar3 < 0.0) {
            if ((-1.0 < *pfVar3 || *pfVar3 == -1.0) || (bVar2)) {
              local_64 = width_1._4_4_;
            }
            else {
              local_64 = -*pfVar3;
            }
            local_60 = local_64;
          }
          else {
            local_60 = *pfVar3;
          }
          *pfVar3 = local_60;
        }
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_layout_row_template_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *layout;

    int i = 0;
    int variable_count = 0;
    int min_variable_count = 0;
    float min_fixed_width = 0.0f;
    float total_fixed_width = 0.0f;
    float max_variable_width = 0.0f;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    win = ctx->current;
    layout = win->layout;
    NK_ASSERT(layout->row.type == NK_LAYOUT_TEMPLATE);
    if (layout->row.type != NK_LAYOUT_TEMPLATE) return;
    for (i = 0; i < layout->row.columns; ++i) {
        float width = layout->row.templates[i];
        if (width >= 0.0f) {
            total_fixed_width += width;
            min_fixed_width += width;
        } else if (width < -1.0f) {
            width = -width;
            total_fixed_width += width;
            max_variable_width = NK_MAX(max_variable_width, width);
            variable_count++;
        } else {
            min_variable_count++;
            variable_count++;
        }
    }
    if (variable_count) {
        float space = nk_layout_row_calculate_usable_space(&ctx->style, layout->type,
                            layout->bounds.w, layout->row.columns);
        float var_width = (NK_MAX(space-min_fixed_width,0.0f)) / (float)variable_count;
        int enough_space = var_width >= max_variable_width;
        if (!enough_space)
            var_width = (NK_MAX(space-total_fixed_width,0)) / (float)min_variable_count;
        for (i = 0; i < layout->row.columns; ++i) {
            float *width = &layout->row.templates[i];
            *width = (*width >= 0.0f)? *width: (*width < -1.0f && !enough_space)? -(*width): var_width;
        }
    }
}